

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

void __thiscall
glslang::TSymbolTableLevel::findFunctionNameList
          (TSymbolTableLevel *this,TString *name,TVector<const_glslang::TFunction_*> *list)

{
  bool bVar1;
  int iVar2;
  size_type __pos;
  reference pvVar3;
  pointer ppVar4;
  undefined4 extraout_var;
  value_type local_80;
  _Self local_78;
  const_iterator it;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>
  local_68;
  const_iterator end;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>
  local_58;
  const_iterator begin;
  TString base;
  size_t parenAt;
  TVector<const_glslang::TFunction_*> *list_local;
  TString *name_local;
  TSymbolTableLevel *this_local;
  
  __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          find_first_of(name,'(',0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&begin,
               name,0,__pos + 1);
  end._M_node = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>_>
                ::lower_bound(&this->level,(key_type *)&begin);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>
  ::_Rb_tree_const_iterator(&local_58,(iterator *)&end);
  pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::operator[]((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)&begin,__pos);
  *pvVar3 = ')';
  it._M_node = (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>_>
               ::upper_bound(&this->level,(key_type *)&begin);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>
  ::_Rb_tree_const_iterator(&local_68,(iterator *)&it);
  local_78._M_node = local_58._M_node;
  while( true ) {
    bVar1 = std::operator!=(&local_78,&local_68);
    if (!bVar1) break;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>
             ::operator->(&local_78);
    iVar2 = (*ppVar4->second->_vptr_TSymbol[7])();
    local_80 = (value_type)CONCAT44(extraout_var,iVar2);
    std::vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>::
    push_back(&list->
               super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
              ,&local_80);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>
    ::operator++(&local_78);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&begin
               );
  return;
}

Assistant:

void findFunctionNameList(const TString& name, TVector<const TFunction*>& list)
    {
        size_t parenAt = name.find_first_of('(');
        TString base(name, 0, parenAt + 1);

        tLevel::const_iterator begin = level.lower_bound(base);
        base[parenAt] = ')';  // assume ')' is lexically after '('
        tLevel::const_iterator end = level.upper_bound(base);
        for (tLevel::const_iterator it = begin; it != end; ++it)
            list.push_back(it->second->getAsFunction());
    }